

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O0

void gai_iterator_init(Integer g_a,Integer *lo,Integer *hi,_iterator_hdl *hdl)

{
  short sVar1;
  undefined4 uVar2;
  global_array_t *pgVar3;
  int iVar4;
  long lVar5;
  long g_a_00;
  Integer IVar6;
  void *pvVar7;
  logical lVar8;
  size_t sVar9;
  long *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  Integer _ndim_5;
  Integer _i_6;
  Integer _itmp_5;
  Integer _ndim_4;
  Integer _i_5;
  Integer _itmp_4;
  int j_2;
  Integer _ndim_3;
  Integer _i_4;
  Integer _itmp_3;
  Integer _ndim_2;
  Integer _i_3;
  Integer _itmp_2;
  C_Integer *block_dims_1;
  int j_1;
  Integer _ndim_1;
  Integer _i_2;
  Integer _itmp_1;
  Integer _ndim;
  Integer _i_1;
  Integer _itmp;
  int *proc_grid;
  C_Integer *block_dims;
  int j;
  int temp;
  int iswap;
  int _i;
  char err_string [256];
  char *str;
  int _l;
  int _d;
  Integer i;
  int nproc;
  int grp;
  Integer ndim;
  Integer handle;
  Integer *in_stack_000005d0;
  Integer *in_stack_000005d8;
  Integer *in_stack_000005e0;
  Integer *in_stack_000005e8;
  Integer *in_stack_000005f0;
  Integer in_stack_000005f8;
  long local_218;
  long local_210;
  long local_200;
  long local_1f8;
  long local_1e0;
  long local_1d8;
  long local_1c8;
  long local_1c0;
  int local_1ac;
  long local_1a0;
  long local_198;
  long local_188;
  long local_180;
  int local_168;
  int local_15c;
  char local_158 [208];
  Integer in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int local_48;
  int local_44;
  long local_40;
  
  lVar5 = in_RDI + 1000;
  g_a_00 = (long)GA[lVar5].ndim;
  IVar6 = pnga_pgroup_nnodes((long)GA[lVar5].p_handle);
  iVar4 = (int)IVar6;
  *in_RCX = in_RDI;
  in_RCX[0xf] = 0;
  in_RCX[0x19] = 0;
  pvVar7 = malloc((long)(iVar4 * 0xe + 1) << 3);
  in_RCX[0x10] = (long)pvVar7;
  pvVar7 = malloc((long)iVar4 << 3);
  in_RCX[0x11] = (long)pvVar7;
  pvVar7 = malloc((long)iVar4 << 2);
  in_RCX[0x12] = (long)pvVar7;
  for (local_40 = 0; pgVar3 = GA, local_40 < g_a_00; local_40 = local_40 + 1) {
    in_RCX[local_40 + 1] = in_RSI[local_40];
    in_RCX[local_40 + 8] = in_RDX[local_40];
  }
  if (GA[lVar5].distr_type == 0) {
    lVar8 = pnga_locate_region(in_stack_000005f8,in_stack_000005f0,in_stack_000005e8,
                               in_stack_000005e0,in_stack_000005d8,in_stack_000005d0);
    if (lVar8 == 0) {
      sprintf(local_158,"%s","cannot locate region: ");
      sVar9 = strlen("cannot locate region: ");
      sprintf(local_158 + (int)sVar9,"%s",GA[in_RDI + 1000].name);
      sVar9 = strlen(local_158);
      sprintf(local_158 + (int)sVar9," [%ld:%ld ",*in_RSI,*in_RDX);
      sVar9 = strlen(local_158);
      local_48 = (int)sVar9;
      for (local_44 = 1; IVar6 = pnga_ndim(g_a_00), local_44 < IVar6; local_44 = local_44 + 1) {
        sprintf(local_158 + local_48,",%ld:%ld ",in_RSI[local_44],in_RDX[local_44]);
        sVar9 = strlen(local_158);
        local_48 = (int)sVar9;
      }
      sprintf(local_158 + local_48,"%s","]");
      strlen(local_158);
      pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    if (in_RCX[0x14] == 1) {
      *(undefined4 *)in_RCX[0x12] = 0;
    }
    else {
      if (GAnproc < in_RCX[0x14]) {
        pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      srand((uint)GAme);
      for (local_15c = 0; (long)local_15c < in_RCX[0x14]; local_15c = local_15c + 1) {
        *(int *)(in_RCX[0x12] + (long)local_15c * 4) = local_15c;
      }
      for (local_15c = 0; (long)local_15c < in_RCX[0x14]; local_15c = local_15c + 1) {
        iVar4 = rand();
        iVar4 = (int)((long)iVar4 % in_RCX[0x14]);
        uVar2 = *(undefined4 *)(in_RCX[0x12] + (long)iVar4 * 4);
        *(undefined4 *)(in_RCX[0x12] + (long)iVar4 * 4) =
             *(undefined4 *)(in_RCX[0x12] + (long)local_15c * 4);
        *(undefined4 *)(in_RCX[0x12] + (long)local_15c * 4) = uVar2;
      }
    }
  }
  else if (GA[lVar5].distr_type == 1) {
    in_RCX[0x16] = 0;
    IVar6 = pnga_nodeid();
    in_RCX[0x17] = IVar6;
  }
  else if (GA[lVar5].distr_type == 2) {
    for (local_168 = 0; local_168 < g_a_00; local_168 = local_168 + 1) {
      in_RCX[(long)local_168 + 0x4b] = pgVar3[lVar5].block_dims[local_168];
      in_RCX[(long)local_168 + 0x2f] =
           pgVar3[lVar5].block_dims[local_168] * (long)pgVar3[lVar5].nblock[local_168];
      in_RCX[(long)local_168 + 0x28] = GA[lVar5].dims[local_168] / in_RCX[(long)local_168 + 0x2f];
      in_RCX[(long)local_168 + 0x36] =
           GA[lVar5].dims[local_168] -
           in_RCX[(long)local_168 + 0x28] * in_RCX[(long)local_168 + 0x2f];
      in_RCX[(long)local_168 + 0x3d] =
           in_RCX[(long)local_168 + 0x28] * pgVar3[lVar5].block_dims[local_168];
      in_RCX[(long)local_168 + 0x44] =
           in_RCX[(long)local_168 + 0x36] / pgVar3[lVar5].block_dims[local_168];
    }
    in_RCX[0x16] = 0;
    in_RCX[0x15] = 0;
    sVar1 = GA[lVar5].ndim;
    local_180 = in_RCX[0x16];
    in_RCX[0x52] = local_180 % (long)GA[lVar5].nblock[0];
    for (local_188 = 1; local_188 < sVar1; local_188 = local_188 + 1) {
      local_180 = (local_180 - in_RCX[local_188 + 0x51]) / (long)GA[lVar5].nblock[local_188 + -1];
      in_RCX[local_188 + 0x52] = local_180 % (long)GA[lVar5].nblock[local_188];
    }
    sVar1 = GA[lVar5].ndim;
    local_198 = in_RCX[0x16];
    in_RCX[0x59] = local_198 % (long)GA[lVar5].nblock[0];
    for (local_1a0 = 1; local_1a0 < sVar1; local_1a0 = local_1a0 + 1) {
      local_198 = (local_198 - in_RCX[local_1a0 + 0x58]) / (long)GA[lVar5].nblock[local_1a0 + -1];
      in_RCX[local_1a0 + 0x59] = local_198 % (long)GA[lVar5].nblock[local_1a0];
    }
  }
  else if (GA[lVar5].distr_type == 3) {
    in_RCX[0x16] = 0;
    in_RCX[0x15] = 0;
    pgVar3 = GA;
    for (local_1ac = 0; local_1ac < g_a_00; local_1ac = local_1ac + 1) {
      in_RCX[(long)local_1ac + 0x4b] = pgVar3[lVar5].block_dims[local_1ac];
    }
    sVar1 = GA[lVar5].ndim;
    local_1c0 = in_RCX[0x16];
    in_RCX[0x52] = local_1c0 % (long)GA[lVar5].nblock[0];
    for (local_1c8 = 1; local_1c8 < sVar1; local_1c8 = local_1c8 + 1) {
      local_1c0 = (local_1c0 - in_RCX[local_1c8 + 0x51]) / (long)GA[lVar5].nblock[local_1c8 + -1];
      in_RCX[local_1c8 + 0x52] = local_1c0 % (long)GA[lVar5].nblock[local_1c8];
    }
    sVar1 = GA[lVar5].ndim;
    local_1d8 = in_RCX[0x16];
    in_RCX[0x59] = local_1d8 % (long)GA[lVar5].nblock[0];
    for (local_1e0 = 1; local_1e0 < sVar1; local_1e0 = local_1e0 + 1) {
      local_1d8 = (local_1d8 - in_RCX[local_1e0 + 0x58]) / (long)GA[lVar5].nblock[local_1e0 + -1];
      in_RCX[local_1e0 + 0x59] = local_1d8 % (long)GA[lVar5].nblock[local_1e0];
    }
  }
  else if (GA[lVar5].distr_type == 4) {
    in_RCX[0x16] = 0;
    in_RCX[0x15] = 0;
    in_RCX[0x13] = (long)GA[lVar5].mapc;
    sVar1 = GA[lVar5].ndim;
    local_1f8 = in_RCX[0x16];
    in_RCX[0x52] = local_1f8 % (long)GA[lVar5].nblock[0];
    for (local_200 = 1; local_200 < sVar1; local_200 = local_200 + 1) {
      local_1f8 = (local_1f8 - in_RCX[local_200 + 0x51]) / (long)GA[lVar5].nblock[local_200 + -1];
      in_RCX[local_200 + 0x52] = local_1f8 % (long)GA[lVar5].nblock[local_200];
    }
    sVar1 = GA[lVar5].ndim;
    local_210 = in_RCX[0x16];
    in_RCX[0x59] = local_210 % (long)GA[lVar5].nblock[0];
    for (local_218 = 1; local_218 < sVar1; local_218 = local_218 + 1) {
      local_210 = (local_210 - in_RCX[local_218 + 0x58]) / (long)GA[lVar5].nblock[local_218 + -1];
      in_RCX[local_218 + 0x59] = local_210 % (long)GA[lVar5].nblock[local_218];
    }
  }
  return;
}

Assistant:

void gai_iterator_init(Integer g_a, Integer lo[], Integer hi[],
                       _iterator_hdl *hdl)
{
  Integer handle = GA_OFFSET + g_a;
  Integer ndim = GA[handle].ndim;
  int grp = GA[handle].p_handle;
  int nproc = pnga_pgroup_nnodes(grp);
  Integer i;
  hdl->g_a = g_a;
  hdl->count = 0;
  hdl->oversize = 0;
  hdl->map = malloc((size_t)(nproc*2*MAXDIM+1)*sizeof(Integer));
  hdl->proclist = malloc(nproc*sizeof(Integer));;
  hdl->proclistperm = malloc(nproc*sizeof(int));
  for (i=0; i<ndim; i++) {
    hdl->lo[i] = lo[i];
    hdl->hi[i] = hi[i];
  }
  /* Standard GA distribution */
  if (GA[handle].distr_type == REGULAR) {
    /* Locate the processors containing some portion of the patch
     * specified by lo and hi and return the results in hdl->map,
     * hdl->proclist, and np. hdl->proclist contains a list of processors
     * containing some portion of the patch, hdl->map contains
     * the lower and upper indices of the portion of the patch held
     * by a given processor, and np contains the total number of
     * processors that contain some portion of the patch.
     */
    if(!pnga_locate_region(g_a, lo, hi, hdl->map, hdl->proclist, &hdl->nproc ))
      ga_RegionError(pnga_ndim(g_a), lo, hi, g_a);

    gaPermuteProcList(hdl->nproc, hdl->proclistperm);

    /* Block-cyclic distribution */
  } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* GA uses simple block cyclic data distribution */
    hdl->iproc = 0;
    hdl->iblock = pnga_nodeid();
  } else if (GA[handle].distr_type == SCALAPACK)  {
    /* GA uses ScaLAPACK block cyclic data distribution */
    int j;
    C_Integer *block_dims;
    /* Scalapack-type block-cyclic data distribution */
    /* Calculate some properties associated with data distribution */
    int *proc_grid = GA[handle].nblock;
    /*num_blocks = GA[handle].num_blocks;*/
    block_dims = GA[handle].block_dims;
    /* blk_dim: length of one repeat unit
     * blk_num: number of repeat units
     * blk_inc: number of elements in last incomplete repeat unit
     * blk_ld: length of complete blocks in repeat unit. Does not
     *         account for partial block at end
     * hlf_blk: number of full blocks in partial repeat unit
     */
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = block_dims[j];
      hdl->blk_dim[j] = block_dims[j]*proc_grid[j];
      hdl->blk_num[j] = GA[handle].dims[j]/hdl->blk_dim[j];
      hdl->blk_inc[j] = GA[handle].dims[j]-hdl->blk_num[j]*hdl->blk_dim[j];
      hdl->blk_ld[j] = hdl->blk_num[j]*block_dims[j];
      hdl->hlf_blk[j] = hdl->blk_inc[j]/block_dims[j];
    }
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED)  {
    int j;
    C_Integer *block_dims;
    hdl->iproc = 0;
    hdl->offset = 0;
    block_dims = GA[handle].block_dims;
    for (j=0; j<ndim; j++)  {
      hdl->blk_size[j] = block_dims[j];
    }
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED_IRREG)  {
    int j;
    hdl->iproc = 0;
    hdl->offset = 0;
    hdl->mapc =  GA[handle].mapc;
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  }
}